

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O0

int Aig_ManFindCut_int(Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,int nFanoutLimit)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_4c;
  int i;
  int CostCur;
  int CostBest;
  Aig_Obj_t *pNext;
  Aig_Obj_t *pFaninBest;
  Aig_Obj_t *pNode;
  int nFanoutLimit_local;
  int nSizeLimit_local;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFront_local;
  
  i = 100;
  pNext = (Aig_Obj_t *)0x0;
  for (local_4c = 0; iVar1 = Vec_PtrSize(vFront), local_4c < iVar1; local_4c = local_4c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vFront,local_4c);
    iVar1 = Aig_NodeGetLeafCostOne(pAVar2,nFanoutLimit);
    if ((iVar1 < i) ||
       ((i == iVar1 &&
        (((uint)((ulong)*(undefined8 *)&pNext->field_0x18 >> 0x20) & 0xffffff) <
         ((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff))))) {
      i = iVar1;
      pNext = pAVar2;
    }
    if (i == 0) break;
  }
  if (pNext == (Aig_Obj_t *)0x0) {
    vFront_local._4_4_ = 0;
  }
  else {
    if (2 < i) {
      __assert_fail("CostBest < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                    ,0x67,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
    }
    iVar1 = Vec_PtrSize(vFront);
    if (nSizeLimit < iVar1 + -1 + i) {
      vFront_local._4_4_ = 0;
    }
    else {
      iVar1 = Aig_ObjIsNode(pNext);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pFaninBest)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                      ,0x6a,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
      }
      Vec_PtrRemove(vFront,pNext);
      pAVar2 = Aig_ObjFanin0(pNext);
      if ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) == 0) {
        *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
        Vec_PtrPush(vFront,pAVar2);
        Vec_PtrPush(vVisited,pAVar2);
      }
      pAVar2 = Aig_ObjFanin1(pNext);
      if ((*(ulong *)&pAVar2->field_0x18 >> 4 & 1) == 0) {
        *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 & 0xffffffffffffffef | 0x10;
        Vec_PtrPush(vFront,pAVar2);
        Vec_PtrPush(vVisited,pAVar2);
      }
      iVar1 = Vec_PtrSize(vFront);
      if (nSizeLimit < iVar1) {
        __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigWin.c"
                      ,0x81,"int Aig_ManFindCut_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
      }
      vFront_local._4_4_ = 1;
    }
  }
  return vFront_local._4_4_;
}

Assistant:

int Aig_ManFindCut_int( Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFront, pNode, i )
    {
        CostCur = Aig_NodeGetLeafCostOne( pNode, nFanoutLimit );
//printf( "    Fanin %s has cost %d.\n", Aig_ObjName(pNode), CostCur );
        if ( CostBest > CostCur ||
            (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
    assert( CostBest < 3 );
    if ( Vec_PtrSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
    assert( Aig_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vFront, pFaninBest );
//printf( "Removing fanin %s.\n", Aig_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Aig_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Aig_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkA )
    {
//printf( "Adding fanin %s.\n", Aig_ObjName(pNext) );
        pNext->fMarkA = 1;
        Vec_PtrPush( vFront, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( Vec_PtrSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}